

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

lyd_difflist * lyd_diff(lyd_node *first,lyd_node *second,int options)

{
  char **ppcVar1;
  int *piVar2;
  undefined8 *puVar3;
  LYS_NODE LVar4;
  long lVar5;
  long lVar6;
  long *plVar7;
  bool bVar8;
  lyd_difflist *plVar9;
  lyd_difflist *plVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  LY_ERR *pLVar15;
  long *plVar16;
  void *pvVar17;
  ly_set *set;
  lys_node *plVar18;
  lyd_node *plVar19;
  lyd_node *plVar20;
  lys_ext *plVar21;
  ulong uVar22;
  LYD_DIFFTYPE *pLVar23;
  lyd_node **pplVar24;
  undefined8 uVar25;
  lyd_node *plVar26;
  ulong uVar27;
  lyd_node *plVar28;
  lys_ext *plVar29;
  char *format;
  ulong uVar30;
  size_t __n;
  lys_node *plStack_b8;
  char *str1;
  lys_node *local_a8;
  lyd_node *local_a0;
  lyd_node *local_98;
  uint local_8c;
  lyd_node *plStack_88;
  uint size2;
  lyd_node *local_80;
  lyd_difflist *local_78;
  ulong local_70;
  uint local_64;
  ulong local_60;
  lyd_node *local_58;
  lyd_difflist *local_50;
  uint local_44;
  long *local_40;
  uint local_34 [2];
  uint size;
  
  local_44 = options;
  if (first == (lyd_node *)0x0) {
    if ((second == (lyd_node *)0x0) || (second->parent == (lyd_node *)0x0)) {
      local_50 = lyd_diff_init_difflist(local_34);
      if (second == (lyd_node *)0x0) {
        return local_50;
      }
      local_78 = (lyd_difflist *)0x0;
      uVar14 = 0;
      do {
        if (((local_44 & 1) != 0) || ((second->field_0x9 & 1) == 0)) {
          iVar12 = lyd_difflist_add(local_50,local_34,uVar14,LYD_DIFF_CREATED,(lyd_node *)0x0,second
                                   );
          if (iVar12 != 0) goto LAB_0015fd9d;
          uVar14 = uVar14 + 1;
        }
        if ((local_44 >> 0xb & 1) != 0) {
          return local_50;
        }
        second = second->next;
        if (second == (lyd_node *)0x0) {
          return local_50;
        }
      } while( true );
    }
    pLVar15 = ly_errno_location();
    *pLVar15 = LY_EINVAL;
    format = "%s: \"first\" parameter is NULL and \"second\" is not top level.";
    goto LAB_001605ce;
  }
  if (second == (lyd_node *)0x0) {
    local_50 = lyd_diff_init_difflist(local_34);
    local_78 = (lyd_difflist *)0x0;
    uVar14 = 0;
    do {
      if (((local_44 & 1) != 0) || ((first->field_0x9 & 1) == 0)) {
        iVar12 = lyd_difflist_add(local_50,local_34,uVar14,LYD_DIFF_DELETED,first,(lyd_node *)0x0);
        if (iVar12 != 0) goto LAB_0015fd9d;
        uVar14 = uVar14 + 1;
      }
      if ((local_44 >> 0xb & 1) != 0) {
        return local_50;
      }
      first = first->next;
      if (first == (lyd_node *)0x0) {
        return local_50;
      }
    } while( true );
  }
  if (((uint)options >> 0xb & 1) == 0) {
    if (first->parent == (lyd_node *)0x0) {
      do {
        local_98 = first;
        first = local_98->prev;
      } while (local_98->prev->next != (lyd_node *)0x0);
    }
    else {
      local_98 = first->parent->child;
    }
    if (second->parent == (lyd_node *)0x0) {
      do {
        plVar26 = second;
        second = plVar26->prev;
      } while (plVar26->prev->next != (lyd_node *)0x0);
    }
    else {
      plVar26 = second->parent->child;
    }
    plVar20 = local_98->parent;
    if (plVar20 == (lyd_node *)0x0) {
LAB_0015fc67:
      if (plVar26->parent == (lyd_node *)0x0) goto LAB_0015fdad;
    }
    else if ((plVar26->parent == (lyd_node *)0x0) || (plVar20->schema == plVar26->parent->schema)) {
      if (plVar20 != (lyd_node *)0x0) goto LAB_0015fdad;
      goto LAB_0015fc67;
    }
    pLVar15 = ly_errno_location();
    *pLVar15 = LY_EINVAL;
    format = "%s: incompatible trees with different parents.";
LAB_001605ce:
    ly_log(LY_LLERR,format,"lyd_diff");
    return (lyd_difflist *)0x0;
  }
  if (first->schema != second->schema) {
    pLVar15 = ly_errno_location();
    *pLVar15 = LY_EINVAL;
    format = "%s: incompatible trees to compare with LYD_OPT_NOSIBLINGS option.";
    goto LAB_001605ce;
  }
  local_98 = first->child;
  plVar26 = second->child;
LAB_0015fdad:
  if (local_98 == plVar26) {
    pLVar15 = ly_errno_location();
    *pLVar15 = LY_EINVAL;
    format = "%s: comparing the same tree does not make sense.";
    goto LAB_001605ce;
  }
  local_50 = lyd_diff_init_difflist(local_34);
  local_78 = lyd_diff_init_difflist(&local_8c);
  plVar16 = (long *)malloc(0x18);
  *(undefined4 *)(plVar16 + 2) = 0;
  pvVar17 = calloc(1,0x10);
  plVar16[1] = (long)pvVar17;
  *plVar16 = 0;
  set = (ly_set *)calloc(1,0x10);
  if (plVar26 != (lyd_node *)0x0) {
    local_64 = local_44 & 1;
    local_70 = 0;
    plStack_88 = local_98;
    local_80 = (lyd_node *)0x0;
    local_60 = 0;
    plVar20 = plVar26;
LAB_0015fe59:
    plVar19 = plStack_88;
    local_40 = plVar16;
    if ((local_64 != 0) || (uVar27 = local_70, (plVar20->field_0x9 & 1) == 0)) {
      for (; plVar19 != (lyd_node *)0x0; plVar19 = plVar19->next) {
        if (plVar19->schema == plVar20->schema) {
          plVar28 = (lyd_node *)plVar16[1];
          plStack_b8 = (lys_node *)0x0;
          local_a8 = (lys_node *)0x0;
          iVar12 = 1;
          if ((local_64 != 0) || ((plVar19->field_0x9 & 1) == 0)) {
            LVar4 = plVar19->schema->nodetype;
            if ((int)LVar4 < 0x10) {
              if (LVar4 == LYS_CONTAINER) {
LAB_001600d5:
                plVar20->validity = plVar20->validity | 0x80;
                ly_set_add((ly_set *)plVar28,plVar19,1);
              }
              else {
                if (LVar4 != LYS_LEAF) {
                  if (LVar4 == LYS_LEAFLIST) goto LAB_0015ff20;
LAB_0015fedc:
                  pLVar15 = ly_errno_location();
                  *pLVar15 = LY_EINT;
                  ly_log(LY_LLERR,"Internal error (%s:%d).",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                         ,0xa24);
                  iVar12 = -1;
                  goto LAB_001600f1;
                }
                if ((plVar19->child != plVar20->child) ||
                   ((local_64 != 0 && (((plVar19->field_0x9 ^ plVar20->field_0x9) & 1) != 0)))) {
                  uVar14 = (uint)local_60;
                  goto LAB_00160061;
                }
              }
            }
            else {
              if ((LVar4 != LYS_ANYDATA) && (LVar4 != LYS_ANYXML)) {
                if (LVar4 != LYS_LIST) goto LAB_0015fedc;
LAB_0015ff20:
                iVar11 = lyd_list_equal(plVar19,plVar20,0,local_64,0);
                if (iVar11 == -1) {
                  iVar12 = -1;
                }
                else if (iVar11 != 0) {
                  plVar18 = plVar19->schema;
                  if ((plVar18->flags & 0x100) != 0) {
                    uVar27 = (ulong)set->number;
                    if (uVar27 == 0) {
                      uVar22 = 0;
                    }
                    else {
                      uVar30 = 0;
                      do {
                        if (((lys_node *)(set->set).s[uVar30]->name == plVar18) &&
                           (uVar22 = uVar30,
                           (lyd_node *)(set->set).s[uVar30]->dsc == plVar19->parent)) break;
                        uVar30 = uVar30 + 1;
                        uVar22 = uVar27;
                      } while (uVar27 != uVar30);
                    }
                    local_58 = plVar28;
                    if ((uint)uVar22 == set->number) {
                      plVar16 = (long *)calloc(1,0x30);
                      *plVar16 = (long)plVar18;
                      plVar16[1] = (long)plVar19->parent;
                      ly_set_add(set,plVar16,1);
                    }
                    ppcVar1 = &(set->set).s[uVar22 & 0xffffffff]->ref;
                    *(int *)ppcVar1 = *(int *)ppcVar1 + 1;
                    plVar28 = local_58;
                  }
                  goto LAB_001600d5;
                }
                goto LAB_001600f1;
              }
              if (plVar19[1].schema == (lys_node *)0x0) {
                lyxml_print_mem((char **)&plStack_b8,(lyxml_elem *)0x0,0x10);
                plVar18 = (lys_node *)
                          lydict_insert_zc(plVar19->schema->module->ctx,(char *)plStack_b8);
                plVar19[1].schema = plVar18;
              }
              plStack_b8 = plVar19[1].schema;
              if (plVar20[1].schema == (lys_node *)0x0) {
                lyxml_print_mem((char **)&local_a8,(lyxml_elem *)0x0,0x10);
                plVar18 = (lys_node *)
                          lydict_insert_zc(plVar20->schema->module->ctx,(char *)local_a8);
                plVar20[1].schema = plVar18;
              }
              local_a8 = plVar20[1].schema;
              if (plStack_b8 != local_a8) {
                uVar14 = (uint)local_60;
LAB_00160061:
                iVar11 = lyd_difflist_add(local_50,local_34,uVar14,LYD_DIFF_CHANGED,plVar19,plVar20)
                ;
                iVar12 = -1;
                local_60 = (ulong)(uVar14 + 1);
                if (iVar11 != 0) goto LAB_001600f1;
              }
            }
            plVar19->validity = plVar19->validity | 0x80;
            iVar12 = 0;
          }
LAB_001600f1:
          plVar16 = local_40;
          if (iVar12 == -1) goto joined_r0x00160989;
          uVar27 = local_70;
          if (iVar12 == 0) goto LAB_001601b3;
        }
      }
      plVar19 = local_80;
      if (plStack_88 != (lyd_node *)0x0) {
        plVar19 = plStack_88->parent;
      }
      uVar14 = (uint)local_70;
      iVar12 = lyd_difflist_add(local_78,&local_8c,uVar14,LYD_DIFF_CREATED,plVar19,plVar20);
      if (iVar12 != 0) goto joined_r0x00160989;
      uVar14 = uVar14 + 1;
      uVar27 = (ulong)uVar14;
      if ((plStack_88 != (lyd_node *)0x0) &&
         (plVar19 = plVar20, (plVar20->schema->flags & 0x100) != 0)) {
        do {
          plVar19 = plVar19->prev;
          if (plVar19->next == (lyd_node *)0x0) {
            plVar19 = (lyd_node *)0x0;
            break;
          }
        } while (plVar19->schema != plVar20->schema);
        iVar12 = lyd_difflist_add(local_78,&local_8c,uVar14,LYD_DIFF_MOVEDAFTER2,plVar19,plVar20);
        if (iVar12 != 0) goto joined_r0x00160989;
        uVar27 = (ulong)((int)local_70 + 2);
      }
    }
LAB_001601b3:
    local_70 = uVar27;
    plVar19 = plVar20->next;
    if (plVar19 == (lyd_node *)0x0) {
      uVar27 = (ulong)set->number;
      while ((uVar27 != 0 &&
             (plVar18 = (set->set).s[uVar27 - 1], lVar6._0_2_ = plVar18->flags,
             lVar6._2_1_ = plVar18->ext_size, lVar6._3_1_ = plVar18->iffeature_size,
             lVar6._4_1_ = plVar18->padding[0], lVar6._5_1_ = plVar18->padding[1],
             lVar6._6_1_ = plVar18->padding[2], lVar6._7_1_ = plVar18->padding[3], lVar6 == 0))) {
        pvVar17 = calloc((ulong)*(uint *)&plVar18->ref,0x18);
        *(void **)&plVar18->flags = pvVar17;
        plVar18->ext = (lys_ext_instance **)0x0;
        *(undefined4 *)&plVar18->ref = 0;
        uVar27 = uVar27 - 1;
      }
      plVar28 = plVar26;
      if (plVar20->parent != plVar26->parent) {
        plVar28 = plVar20->parent->child;
      }
      bVar8 = true;
      plVar20 = plVar28;
      if (plVar28 == (lyd_node *)0x0) {
LAB_001602ee:
        plVar19 = (lyd_node *)0x0;
      }
      else {
        do {
          local_58 = plVar20;
          if ((char)plVar28->validity < '\0') {
            if ((int)local_40[2] == *(int *)(local_40[1] + 4)) {
              plVar20 = local_58;
              if (plVar28 == local_58) goto LAB_001602ee;
              pLVar15 = ly_errno_location();
              *pLVar15 = LY_EINT;
              uVar25 = 0xb80;
              goto LAB_0016097b;
            }
            plVar28->validity = plVar28->validity & 0x7f;
            if (((plVar28->schema->nodetype & (LYS_LIST|LYS_LEAFLIST)) != LYS_UNKNOWN) &&
               ((plVar28->schema->flags & 0x100) != 0)) {
              for (uVar27 = (ulong)set->number; uVar27 != 0; uVar27 = uVar27 - 1) {
                plVar18 = (set->set).s[uVar27 - 1];
                if (((lys_node *)plVar18->name == plVar28->schema) &&
                   (iVar12 = lyd_diff_equivnode((lyd_node *)plVar18->dsc,plVar28->parent),
                   iVar12 != 0)) {
                  lyd_diff_move_preprocess
                            ((diff_ordered *)plVar18,
                             *(lyd_node **)
                              (*(long *)(local_40[1] + 8) + (ulong)*(uint *)(local_40 + 2) * 8),
                             plVar28);
                  break;
                }
              }
            }
            plVar16 = local_40;
            plVar18 = plVar28->schema;
            if (((plVar18->nodetype & (LYS_LIST|LYS_CONTAINER)) != LYS_UNKNOWN) &&
               (plVar19 = plVar28->child, plVar19 != (lyd_node *)0x0)) {
              lVar6 = local_40[1];
              uVar14 = *(uint *)(lVar6 + 4);
              uVar13 = *(uint *)(local_40 + 2);
              uVar27 = (ulong)uVar13;
              if (uVar13 < uVar14) goto LAB_00160556;
              goto LAB_00160582;
            }
            *(int *)(local_40 + 2) = (int)local_40[2] + 1;
          }
          plVar28 = plVar28->next;
          plVar20 = local_58;
        } while (plVar28 != (lyd_node *)0x0);
        plVar19 = (lyd_node *)0x0;
      }
      goto LAB_001602f0;
    }
    goto LAB_00160344;
  }
  local_60 = 0;
  local_70 = 0;
LAB_001605f6:
  ly_set_free((ly_set *)plVar16[1]);
  free(plVar16);
  if (local_98 != (lyd_node *)0x0) {
    plVar26 = local_98;
    do {
      if ((char)plVar26->validity < '\0') {
        plVar26->validity = plVar26->validity & 0x7f;
LAB_00160666:
        if ((plVar26->schema->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
          plVar20 = plVar26->child;
        }
        else {
          plVar20 = (lyd_node *)0x0;
        }
        if (plVar20 == (lyd_node *)0x0) goto LAB_00160681;
      }
      else {
        if (((local_44 & 1) == 0) && ((plVar26->field_0x9 & 1) != 0)) goto LAB_00160666;
        uVar14 = (uint)local_60;
        iVar12 = lyd_difflist_add(local_50,local_34,uVar14,LYD_DIFF_DELETED,plVar26,(lyd_node *)0x0)
        ;
        if (iVar12 != 0) goto LAB_001608ad;
        local_60 = (ulong)(uVar14 + 1);
LAB_00160681:
        plVar20 = plVar26->next;
      }
      if (plVar20 == (lyd_node *)0x0) {
        for (plVar26 = plVar26->parent;
            (plVar26 != local_98->parent && (plVar20 = plVar26->next, plVar20 == (lyd_node *)0x0));
            plVar26 = plVar26->parent) {
        }
      }
      plVar26 = plVar20;
    } while (plVar20 != (lyd_node *)0x0);
  }
  if (set->number != 0) {
    uVar27 = 0;
    do {
      plVar18 = (set->set).s[uVar27];
      plVar29 = (lys_ext *)plVar18->ext;
      plVar21 = plVar29;
      if (*(int *)&plVar29->dsc != 0) {
        do {
          while (*(int *)&plVar29->dsc != 0) {
            uVar14 = *(uint *)&plVar18->ref;
            if (uVar14 == 0) {
              uVar22 = 0;
            }
            else {
              plVar16 = (long *)(*(long *)&plVar18->flags + 0x10);
              uVar22 = 0;
              do {
                if ((lys_ext *)*plVar16 == plVar29) goto LAB_00160718;
                uVar13 = (int)uVar22 + 1;
                uVar22 = (ulong)uVar13;
                plVar16 = plVar16 + 3;
              } while (uVar14 != uVar13);
              uVar22 = (ulong)uVar14;
            }
LAB_00160718:
            plVar26 = *(lyd_node **)(*(long *)&plVar18->flags + uVar22 * 0x18);
            puVar3 = (undefined8 *)(*(long *)&plVar18->flags + 8 + uVar22 * 0x18);
            plStack_b8 = (lys_node *)*puVar3;
            str1 = (char *)puVar3[1];
            iVar12 = *(int *)&plVar29->dsc;
            if (iVar12 < 1) {
              while (iVar12 != 0) {
                lVar6 = *(long *)&plVar18->flags;
                lVar5 = uVar22 * 0x18;
                uVar22 = (ulong)((int)uVar22 - 1);
                *(undefined8 *)(lVar6 + 0x10 + lVar5) =
                     *(undefined8 *)(lVar6 + 0x10 + uVar22 * 0x18);
                puVar3 = (undefined8 *)(lVar6 + uVar22 * 0x18);
                uVar25 = puVar3[1];
                *(undefined8 *)(lVar6 + lVar5) = *puVar3;
                ((undefined8 *)(lVar6 + lVar5))[1] = uVar25;
                piVar2 = (int *)(*(long *)(*(long *)&plVar18->flags + 0x10 + lVar5) + 8);
                *piVar2 = *piVar2 + -1;
                ppcVar1 = &plVar29->dsc;
                *(int *)ppcVar1 = *(int *)ppcVar1 + 1;
                iVar12 = *(int *)ppcVar1;
              }
            }
            else {
              do {
                lVar6 = *(long *)&plVar18->flags;
                lVar5 = uVar22 * 0x18;
                uVar22 = (ulong)((int)uVar22 + 1);
                *(undefined8 *)(lVar6 + 0x10 + lVar5) =
                     *(undefined8 *)(lVar6 + 0x10 + uVar22 * 0x18);
                puVar3 = (undefined8 *)(lVar6 + uVar22 * 0x18);
                uVar25 = puVar3[1];
                *(undefined8 *)(lVar6 + lVar5) = *puVar3;
                ((undefined8 *)(lVar6 + lVar5))[1] = uVar25;
                piVar2 = (int *)(*(long *)(*(long *)&plVar18->flags + 0x10 + lVar5) + 8);
                *piVar2 = *piVar2 + 1;
                ppcVar1 = &plVar29->dsc;
                *(int *)ppcVar1 = *(int *)ppcVar1 + -1;
              } while (*(int *)ppcVar1 != 0);
            }
            lVar6 = *(long *)&plVar18->flags;
            *(lyd_node **)(lVar6 + uVar22 * 0x18) = plVar26;
            puVar3 = (undefined8 *)(lVar6 + 8 + uVar22 * 0x18);
            *puVar3 = plStack_b8;
            puVar3[1] = str1;
            if ((int)uVar22 == 0) {
              plVar20 = (lyd_node *)0x0;
            }
            else {
              plVar20 = *(lyd_node **)(*(long *)&plVar18->flags + (ulong)((int)uVar22 - 1) * 0x18);
            }
            uVar14 = (uint)local_60;
            iVar12 = lyd_difflist_add(local_50,local_34,uVar14,LYD_DIFF_MOVEDAFTER1,plVar26,plVar20)
            ;
            if (iVar12 != 0) goto LAB_001608ad;
            local_60 = (ulong)(uVar14 + 1);
            plVar29 = (lys_ext *)plVar29->name;
            plVar21 = plVar29;
          }
          plVar29 = (lys_ext *)plVar29->name;
        } while (plVar29 != plVar21);
      }
      uVar27 = uVar27 + 1;
    } while (uVar27 < set->number);
  }
  diff_ordset_free(set);
  plVar10 = local_50;
  uVar27 = local_60;
  iVar12 = (int)local_70;
  if (iVar12 == 0) goto LAB_00160895;
  uVar14 = iVar12 + (int)local_60 + 1;
  if (uVar14 < local_34[0]) {
LAB_00160843:
    plVar9 = local_78;
    uVar27 = uVar27 & 0xffffffff;
    memcpy(plVar10->type + uVar27,local_78->type,(ulong)(iVar12 + 1) * 4);
    __n = (ulong)(iVar12 + 1) << 3;
    memcpy(plVar10->first + uVar27,plVar9->first,__n);
    memcpy(plVar10->second + uVar27,plVar9->second,__n);
LAB_00160895:
    lyd_free_diff(local_78);
    ly_err_clean(1);
    return plVar10;
  }
  local_34[0] = uVar14;
  pLVar23 = (LYD_DIFFTYPE *)realloc(local_50->type,(ulong)uVar14 << 2);
  if (pLVar23 != (LYD_DIFFTYPE *)0x0) {
    plVar10->type = pLVar23;
    pplVar24 = (lyd_node **)realloc(plVar10->first,(ulong)local_34[0] << 3);
    if (pplVar24 != (lyd_node **)0x0) {
      plVar10->first = pplVar24;
      pplVar24 = (lyd_node **)realloc(plVar10->second,(ulong)local_34[0] << 3);
      if (pplVar24 != (lyd_node **)0x0) {
        plVar10->second = pplVar24;
        goto LAB_00160843;
      }
    }
  }
  pLVar15 = ly_errno_location();
  *pLVar15 = LY_EMEM;
  ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyd_diff");
LAB_0015fd9d:
  set = (ly_set *)0x0;
  plVar16 = (long *)0x0;
joined_r0x00160989:
  while (plVar16 != (long *)0x0) {
    plVar7 = (long *)*plVar16;
    ly_set_free((ly_set *)plVar16[1]);
    free(plVar16);
    plVar16 = plVar7;
  }
  diff_ordset_free(set);
  lyd_free_diff(local_50);
  lyd_free_diff(local_78);
  return (lyd_difflist *)0x0;
  while( true ) {
    *(uint *)(local_40 + 2) = uVar13;
    uVar27 = uVar27 + 1;
    if (uVar13 == uVar14) break;
LAB_00160556:
    uVar13 = uVar13 + 1;
    if ((lys_node *)**(long **)(*(long *)(lVar6 + 8) + uVar27 * 8) == plVar18) goto LAB_00160582;
  }
  uVar27 = (ulong)uVar14;
LAB_00160582:
  if ((uint)uVar27 == uVar14) {
    pLVar15 = ly_errno_location();
    *pLVar15 = LY_EINT;
    uVar25 = 0xb99;
LAB_001608d5:
    ly_log(LY_LLERR,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
           ,uVar25);
    goto joined_r0x00160989;
  }
  plVar20 = *(lyd_node **)(*(long *)(lVar6 + 8) + (uVar27 & 0xffffffff) * 8);
  plStack_88 = plVar20->child;
  if (plStack_88 == (lyd_node *)0x0) {
    local_80 = plVar20;
  }
  *(uint *)(local_40 + 2) = (uint)uVar27 + 1;
  bVar8 = false;
  plVar20 = local_58;
LAB_001602f0:
  if (bVar8) {
    plVar16 = local_40;
    if (plVar20 == plVar26) goto LAB_001605f6;
  }
  else {
    plVar16 = (long *)malloc(0x18);
    *(undefined4 *)(plVar16 + 2) = 0;
    pvVar17 = calloc(1,0x10);
    plVar16[1] = (long)pvVar17;
    *plVar16 = (long)local_40;
  }
LAB_00160344:
  if (plVar19 == (lyd_node *)0x0) {
LAB_00160364:
    local_58 = plVar20;
    if (plVar16[1] != 0) {
      *(undefined4 *)(plVar16[1] + 4) = 0;
    }
    *(undefined4 *)(plVar16 + 2) = 0;
    plVar20 = local_58->parent->next;
    local_a0 = plVar19;
    if (plVar20 != (lyd_node *)0x0) {
      lVar6 = *plVar16;
      local_40 = plVar16;
      do {
        plVar16 = local_40;
        if ((char)plVar20->validity < '\0') {
          if (*(int *)(lVar6 + 0x10) == *(int *)(*(long *)(lVar6 + 8) + 4)) {
            bVar8 = true;
            plVar19 = local_a0;
            if (plVar20 == local_58->parent->next) goto LAB_00160451;
            pLVar15 = ly_errno_location();
            *pLVar15 = LY_EINT;
            uVar25 = 0xbcd;
            goto LAB_001608d5;
          }
          plVar20->validity = plVar20->validity & 0x7f;
          if (((plVar20->schema->nodetype & (LYS_LIST|LYS_LEAFLIST)) != LYS_UNKNOWN) &&
             ((plVar20->schema->flags & 0x100) != 0)) {
            for (uVar27 = (ulong)set->number; uVar27 != 0; uVar27 = uVar27 - 1) {
              plVar18 = (set->set).s[uVar27 - 1];
              if (((lys_node *)plVar18->name == plVar20->schema) &&
                 (iVar12 = lyd_diff_equivnode((lyd_node *)plVar18->dsc,plVar20->parent), iVar12 != 0
                 )) {
                lyd_diff_move_preprocess
                          ((diff_ordered *)plVar18,
                           *(lyd_node **)
                            (*(long *)(*(long *)(lVar6 + 8) + 8) +
                            (ulong)*(uint *)(lVar6 + 0x10) * 8),plVar20);
                break;
              }
            }
          }
          plVar18 = plVar20->schema;
          if (((plVar18->nodetype & (LYS_LIST|LYS_CONTAINER)) != LYS_UNKNOWN) &&
             (plVar19 = plVar20->child, plVar19 != (lyd_node *)0x0)) {
            lVar5 = *(long *)(lVar6 + 8);
            uVar14 = *(uint *)(lVar5 + 4);
            uVar13 = *(uint *)(lVar6 + 0x10);
            uVar27 = (ulong)uVar13;
            if (uVar13 < uVar14) goto LAB_001604d5;
            goto LAB_001604fb;
          }
          *(int *)(lVar6 + 0x10) = *(int *)(lVar6 + 0x10) + 1;
        }
        plVar20 = plVar20->next;
        plVar16 = local_40;
      } while (plVar20 != (lyd_node *)0x0);
    }
    bVar8 = true;
    plVar19 = local_a0;
    goto LAB_00160451;
  }
LAB_0016034c:
  plVar20 = plVar19;
  if (plVar19 == (lyd_node *)0x0) goto LAB_001605f6;
  goto LAB_0015fe59;
  while( true ) {
    *(uint *)(lVar6 + 0x10) = uVar13;
    uVar27 = uVar27 + 1;
    if (uVar13 == uVar14) break;
LAB_001604d5:
    uVar13 = uVar13 + 1;
    if ((lys_node *)**(long **)(*(long *)(lVar5 + 8) + uVar27 * 8) == plVar18) goto LAB_001604fb;
  }
  uVar27 = (ulong)uVar14;
LAB_001604fb:
  if ((uint)uVar27 != uVar14) {
    plVar20 = *(lyd_node **)(*(long *)(lVar5 + 8) + (uVar27 & 0xffffffff) * 8);
    plStack_88 = plVar20->child;
    if (plStack_88 == (lyd_node *)0x0) {
      local_80 = plVar20;
    }
    *(uint *)(lVar6 + 0x10) = (uint)uVar27 + 1;
    bVar8 = false;
    plVar16 = local_40;
LAB_00160451:
    if (bVar8) {
      local_58 = local_58->parent;
      ly_set_free((ly_set *)plVar16[1]);
      plVar7 = (long *)*plVar16;
      free(plVar16);
      plVar16 = plVar7;
      if (*plVar7 == 0) goto LAB_0016034c;
    }
    plVar20 = local_58;
    if (plVar19 != (lyd_node *)0x0) goto LAB_0016034c;
    goto LAB_00160364;
  }
  pLVar15 = ly_errno_location();
  *pLVar15 = LY_EINT;
  uVar25 = 0xbe6;
LAB_0016097b:
  ly_log(LY_LLERR,"Internal error (%s:%d).",
         "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c",
         uVar25);
  plVar16 = local_40;
  goto joined_r0x00160989;
LAB_001608ad:
  plVar16 = (long *)0x0;
  goto joined_r0x00160989;
}

Assistant:

lyd_difflist *
lyd_diff(struct lyd_node *first, struct lyd_node *second, int options)
{
    int rc;
    struct lyd_node *elem1, *elem2, *iter, *aux, *parent = NULL, *next1, *next2;
    struct lyd_difflist *result, *result2 = NULL;
    void *new;
    unsigned int size, size2, index = 0, index2 = 0, i, j, k;
    struct matchlist_s {
        struct matchlist_s *prev;
        struct ly_set *match;
        unsigned int i;
    } *matchlist = NULL, *mlaux;
    struct ly_set *ordset = NULL;
    struct diff_ordered *ordered;
    struct diff_ordered_dist *dist_aux, *dist_iter;
    struct diff_ordered_item item_aux;

    if (!first) {
        /* all nodes in second were created,
         * but the second must be top level */
        if (second && second->parent) {
            LOGERR(LY_EINVAL, "%s: \"first\" parameter is NULL and \"second\" is not top level.", __func__);
            return NULL;
        }
        result = lyd_diff_init_difflist(&size);
        LY_TREE_FOR(second, iter) {
            if (!iter->dflt || (options & LYD_DIFFOPT_WITHDEFAULTS)) { /* skip the implicit nodes */
                if (lyd_difflist_add(result, &size, index++, LYD_DIFF_CREATED, NULL, iter)) {
                    goto error;
                }
            }
            if (options & LYD_DIFFOPT_NOSIBLINGS) {
                break;
            }
        }
        return result;
    } else if (!second) {
        /* all nodes from first were deleted */
        result = lyd_diff_init_difflist(&size);
        LY_TREE_FOR(first, iter) {
            if (!iter->dflt || (options & LYD_DIFFOPT_WITHDEFAULTS)) { /* skip the implicit nodes */
                if (lyd_difflist_add(result, &size, index++, LYD_DIFF_DELETED, iter, NULL)) {
                    goto error;
                }
            }
            if (options & LYD_DIFFOPT_NOSIBLINGS) {
                break;
            }
        }
        return result;
    }

    if (options & LYD_DIFFOPT_NOSIBLINGS) {
        /* both trees must start at the same (schema) node */
        if (first->schema != second->schema) {
            LOGERR(LY_EINVAL, "%s: incompatible trees to compare with LYD_OPT_NOSIBLINGS option.", __func__);
            return NULL;
        }
        /* use first's and second's child to make comparison the same as without LYD_OPT_NOSIBLINGS */
        first = first->child;
        second = second->child;
    } else {
        /* go to the first sibling in both trees */
        if (first->parent) {
            first = first->parent->child;
        } else {
            while (first->prev->next) {
                first = first->prev;
            }
        }

        if (second->parent) {
            second = second->parent->child;
        } else {
            for (; second->prev->next; second = second->prev);
        }

        /* check that both has the same (schema) parent or that they are top-level nodes */
        if ((first->parent && second->parent && first->parent->schema != second->parent->schema) ||
                (!first->parent && first->parent != second->parent)) {
            LOGERR(LY_EINVAL, "%s: incompatible trees with different parents.", __func__);
            return NULL;
        }
    }
    if (first == second) {
        LOGERR(LY_EINVAL, "%s: comparing the same tree does not make sense.", __func__);
        return NULL;
    }

    /* initiate resulting structure */
    result = lyd_diff_init_difflist(&size);

    /* the records about created and moved items are created in
     * bad order, so the records about created nodes (and their
     * possible moving) is stored separately and added to the
     * main result at the end.
     */
    result2 = lyd_diff_init_difflist(&size2);

    matchlist = malloc(sizeof *matchlist);
    matchlist->i = 0;
    matchlist->match = ly_set_new();
    matchlist->prev = NULL;

    ordset = ly_set_new();

    /*
     * compare trees
     */
    /* 1) newly created nodes + changed leafs/anyxmls */
    next1 = first;
    for (elem2 = next2 = second; elem2; elem2 = next2) {
        /* keep right pointer for searching in the first tree */
        elem1 = next1;

        if (elem2->dflt && !(options & LYD_DIFFOPT_WITHDEFAULTS)) {
            /* skip default elements, they could not be created or changed, just deleted */
            goto cmp_continue;
        }

        /* search for elem2 instance in the first */
        LY_TREE_FOR(elem1, iter) {
            if (iter->schema != elem2->schema) {
                continue;
            }

            /* elem2 instance found */
            rc = lyd_diff_compare(iter, elem2, result, &size, &index, matchlist->match, ordset, options);
            if (rc == -1) {
                goto error;
            } else if (rc == 0) {
                /* match */
                break;
            } /* else, continue */
        }

        if (!iter) {
            /* elem2 not found in the first tree */
            if (lyd_difflist_add(result2, &size2, index2++, LYD_DIFF_CREATED, elem1 ? elem1->parent : parent, elem2)) {
                goto error;
            }

            if (elem1 && (elem2->schema->flags & LYS_USERORDERED)) {
                /* store the correct place where the node is supposed to be moved after creation */
                /* if elem1 does not exist, all nodes were created and they will be created in
                 * correct order, so it is not needed to detect moves */
                for (aux = elem2->prev; aux->next; aux = aux->prev) {
                    if (aux->schema == elem2->schema) {
                        /* predecessor found */
                        break;
                    }
                }
                if (!aux->next) {
                    /* predecessor not found */
                    aux = NULL;
                }
                if (lyd_difflist_add(result2, &size2, index2++, LYD_DIFF_MOVEDAFTER2, aux, elem2)) {
                    goto error;
                }
            }
        }

cmp_continue:
        /* select element for the next run                                    1     2
         * - first, process all siblings of a single parent                  / \   / \
         * - then, go to children (deep)                                    3   4 7   8
         * - return to the parent's next sibling children                  / \
         *                                                                5   6
         */
        /* siblings first */
        next1 = elem1;
        next2 = elem2->next;

        if (!next2) {
            /* children */

            /* first pass of the siblings done, some additional work for future
             * detection of move may be needed */
            for (i = ordset->number; i > 0; i--) {
                ordered = (struct diff_ordered *)ordset->set.g[i - 1];
                if (ordered->items) {
                    /* already preprocessed ordered structure */
                    break;
                }
                ordered->items = calloc(ordered->count, sizeof *ordered->items);
                ordered->dist = NULL;
                /* zero the count to be used as a node position in lyd_diff_move_preprocess() */
                ordered->count = 0;
            }

            /* first, get the first sibling */
            if (elem2->parent == second->parent) {
                elem2 = second;
            } else {
                elem2 = elem2->parent->child;
            }

            /* and then find the first child */
            for (iter = elem2; iter; iter = iter->next) {
                if (!(iter->validity & LYD_VAL_INUSE)) {
                    /* the iter is not present in both trees */
                    continue;
                } else if (matchlist->i == matchlist->match->number) {
                    if (iter == elem2) {
                        /* we already went through all the matching nodes and now we are just supposed to stop
                         * the loop with no iter */
                        iter = NULL;
                        break;
                    } else {
                        /* we have started with some not processed data in matchlist, but now we have
                         * the INUSE iter and no nodes in matchlist to find its equivalent,
                         * so something went wrong somewhere */
                        LOGINT;
                        goto error;
                    }
                }

                iter->validity &= ~LYD_VAL_INUSE;
                if ((iter->schema->nodetype & (LYS_LEAFLIST | LYS_LIST)) && (iter->schema->flags & LYS_USERORDERED)) {
                    for (j = ordset->number; j > 0; j--) {
                        ordered = (struct diff_ordered *)ordset->set.g[j - 1];
                        if (ordered->schema != iter->schema || !lyd_diff_equivnode(ordered->parent, iter->parent)) {
                            continue;
                        }

                        /* store necessary information for move detection */
                        lyd_diff_move_preprocess(ordered, matchlist->match->set.d[matchlist->i], iter);
                        break;
                    }
                }

                if ((iter->schema->nodetype & (LYS_CONTAINER | LYS_LIST)) && iter->child) {
                    while (matchlist->i < matchlist->match->number && matchlist->match->set.d[matchlist->i]->schema != iter->schema) {
                        matchlist->i++;
                    }
                    if (matchlist->i == matchlist->match->number) {
                        /* we have the INUSE iter, so we have to find its equivalent in match list */
                        LOGINT;
                        goto error;
                    }
                    next1 = matchlist->match->set.d[matchlist->i]->child;
                    if (!next1) {
                        parent = matchlist->match->set.d[matchlist->i];
                    }
                    matchlist->i++;
                    next2 = iter->child;
                    break;
                }
                matchlist->i++;
            }

            if (!iter) {
                /* no child/data on next level */
                if (elem2 == second) {
                    /* done */
                    break;
                }
            } else {
                /* create new matchlist item */
                mlaux = malloc(sizeof *mlaux);
                mlaux->i = 0;
                mlaux->match = ly_set_new();
                mlaux->prev = matchlist;
                matchlist = mlaux;
            }
        }

        while (!next2) {
            /* parent */

            /* clean the last match set */
            ly_set_clean(matchlist->match);
            matchlist->i = 0;

            /* try to go to a cousin - child of the next parent's sibling */
            mlaux = matchlist->prev;
            for (iter = elem2->parent->next; iter; iter = iter->next) {
                if (!(iter->validity & LYD_VAL_INUSE)) {
                    continue;
                } else if (mlaux->i == mlaux->match->number) {
                    if (iter == elem2->parent->next) {
                        /* we already went through all the matching nodes and now we are just supposed to stop
                         * the loop with no iter */
                        iter = NULL;
                        break;
                    } else {
                        /* we have started with some not processed data in matchlist, but now we have
                         * the INUSE iter and no nodes in matchlist to find its equivalent,
                         * so something went wrong somewhere */
                        LOGINT;
                        goto error;
                    }
                }

                iter->validity &= ~LYD_VAL_INUSE;
                if ((iter->schema->nodetype & (LYS_LEAFLIST | LYS_LIST)) && (iter->schema->flags & LYS_USERORDERED)) {
                    for (j = ordset->number ; j > 0; j--) {
                        ordered = (struct diff_ordered *)ordset->set.g[j - 1];
                        if (ordered->schema != iter->schema || !lyd_diff_equivnode(ordered->parent, iter->parent)) {
                            continue;
                        }

                        /* store necessary information for move detection */
                        lyd_diff_move_preprocess(ordered, mlaux->match->set.d[mlaux->i], iter);
                        break;
                    }
                }

                if ((iter->schema->nodetype & (LYS_CONTAINER | LYS_LIST)) && iter->child) {
                    while (mlaux->i < mlaux->match->number && mlaux->match->set.d[mlaux->i]->schema != iter->schema) {
                        mlaux->i++;
                    }
                    if (mlaux->i == mlaux->match->number) {
                        /* we have the INUSE iter, so we have to find its equivalent in match list */
                        LOGINT;
                        goto error;
                    }
                    next1 = mlaux->match->set.d[mlaux->i]->child;
                    if (!next1) {
                        parent = mlaux->match->set.d[mlaux->i];
                    }
                    mlaux->i++;
                    next2 = iter->child;
                    break;
                }
                mlaux->i++;
            }

            /* if no cousin exists, continue next loop on higher level */
            if (!iter) {
                elem2 = elem2->parent;

                /* remove matchlist item */
                ly_set_free(matchlist->match);
                mlaux = matchlist;
                matchlist = matchlist->prev;
                free(mlaux);

                if (!matchlist->prev) { /* elem2->parent == second->parent */
                    /* done */
                    break;
                }
            }
        }
    }

    ly_set_free(matchlist->match);
    free(matchlist);
    matchlist = NULL;


    /* 2) deleted nodes */
    LY_TREE_DFS_BEGIN(first, next1, elem1) {
        /* search for elem1s deleted in the second */
        if (elem1->validity & LYD_VAL_INUSE) {
            /* erase temporary LYD_VAL_INUSE flag and continue into children */
            elem1->validity &= ~LYD_VAL_INUSE;
        } else if (!elem1->dflt || (options & LYD_DIFFOPT_WITHDEFAULTS)) {
            /* elem1 has no matching node in second, add it into result */
            if (lyd_difflist_add(result, &size, index++, LYD_DIFF_DELETED, elem1, NULL)) {
                goto error;
            }

            /* skip subtree processing of data missing in the second tree */
            goto dfs_nextsibling;
        }

        /* modified LY_TREE_DFS_END() */
        /* select element for the next run - children first */
        if (elem1->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA)) {
            next1 = NULL;
        } else {
            next1 = elem1->child;
        }
        if (!next1) {
dfs_nextsibling:
            /* try siblings */
            next1 = elem1->next;
        }
        while (!next1) {
            /* parent is already processed, go to its sibling */

            elem1 = elem1->parent;
            if (elem1 == first->parent) {
                /* we are done, no next element to process */
                break;
            }

            next1 = elem1->next;
        }
    }

    /* 3) moved nodes (when user-ordered) */
    for (i = 0; i < ordset->number; i++) {
        ordered = (struct diff_ordered *)ordset->set.g[i];
        if (!ordered->dist->dist) {
            /* the dist list is sorted here, but the biggest dist is 0,
             * so nothing changed in order of these items between first
             * and second. We can continue with another user-ordered list.
             */
            continue;
        }

        /* get needed movements
         * - from the biggest distances try to apply node movements
         * on first tree node until they will be ordered as in the
         * second tree - i.e. until there will be no position difference
         */

        for (dist_iter = ordered->dist; ; dist_iter = dist_iter->next) {
            /* dist list is sorted at the beginning, since applying a move causes
             * just a small change in other distances, we assume that the biggest
             * dist is the next one (note that dist list is implemented as ring
             * list). This way we avoid sorting distances after each move. The loop
             * stops when all distances are zero.
             */
            dist_aux = dist_iter;
            while (!dist_iter->dist) {
                /* no dist, so no move. Try another, but when
                 * there is no dist at all, stop the loop
                 */
                dist_iter = dist_iter->next;
                if (dist_iter == dist_aux) {
                    /* all dist we zeroed */
                    goto movedone;
                }
            }
            /* something to move */

            /* get the item to move */
            for (k = 0; k < ordered->count; k++) {
                if (ordered->items[k].dist == dist_iter) {
                    break;
                }
            }

            /* apply the move (distance) */
            memcpy(&item_aux, &ordered->items[k], sizeof item_aux);
            if (dist_iter->dist > 0) {
                /* move to right (other move to left) */
                while (dist_iter->dist) {
                    memcpy(&ordered->items[k], &ordered->items[k + 1], sizeof *ordered->items);
                    ordered->items[k].dist->dist++; /* update moved item distance */
                    dist_iter->dist--;
                    k++;
                }
            } else {
                /* move to left (other move to right) */
                while (dist_iter->dist) {
                    memcpy(&ordered->items[k], &ordered->items[k - 1], sizeof *ordered->items);
                    ordered->items[k].dist->dist--; /* update moved item distance */
                    dist_iter->dist++;
                    k--;
                }
            }
            memcpy(&ordered->items[k], &item_aux, sizeof *ordered->items);

            /* store the transaction into the difflist */
            if (lyd_difflist_add(result, &size, index++, LYD_DIFF_MOVEDAFTER1, item_aux.first,
                                 (k > 0) ? ordered->items[k - 1].first : NULL)) {
                goto error;
            }
            continue;

movedone:
            break;
        }
    }

    diff_ordset_free(ordset);
    ordset = NULL;

    if (index2) {
        /* append result2 with newly created
         * (and possibly moved) nodes */
        if (index + index2 + 1 >= size) {
            /* result must be enlarged */
            size = index + index2 + 1;
            new = realloc(result->type, size * sizeof *result->type);
            if (!new) {
                LOGMEM;
                goto error;
            }
            result->type = new;

            new = realloc(result->first, size * sizeof *result->first);
            if (!new) {
                LOGMEM;
                goto error;
            }
            result->first = new;

            new = realloc(result->second, size * sizeof *result->second);
            if (!new) {
                LOGMEM ;
                goto error;
            }
            result->second = new;
        }

        /* append */
        memcpy(&result->type[index], result2->type, (index2 + 1) * sizeof *result->type);
        memcpy(&result->first[index], result2->first, (index2 + 1) * sizeof *result->first);
        memcpy(&result->second[index], result2->second, (index2 + 1) * sizeof *result->second);
    }
    lyd_free_diff(result2);

    ly_err_clean(1);
    return result;

error:

    while (matchlist) {
        mlaux = matchlist;
        matchlist = mlaux->prev;
        ly_set_free(mlaux->match);
        free(mlaux);

    }
    diff_ordset_free(ordset);

    lyd_free_diff(result);
    lyd_free_diff(result2);

    return NULL;
}